

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

size_t google::protobuf::internal::WireFormatLite::SInt64Size(RepeatedField<long> *value)

{
  int iVar1;
  const_reference plVar2;
  size_t sVar3;
  size_t sVar4;
  int index;
  
  iVar1 = RepeatedField<long>::size(value);
  sVar4 = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  for (index = 0; iVar1 != index; index = index + 1) {
    plVar2 = RepeatedField<long>::Get(value,index);
    sVar3 = SInt64Size(*plVar2);
    sVar4 = sVar4 + sVar3;
  }
  return sVar4;
}

Assistant:

size_t WireFormatLite::SInt64Size(const RepeatedField<int64_t>& value) {
  size_t out = 0;
  const int n = value.size();
  for (int i = 0; i < n; i++) {
    out += SInt64Size(value.Get(i));
  }
  return out;
}